

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float128_rem_mips64(float128 a,float128 b,float_status *status)

{
  float128 fVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  char cVar6;
  ulong uVar7;
  uint64_t zSig1;
  long lVar8;
  long lVar9;
  uint64_t zSig0;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t bLow;
  ulong uVar13;
  ulong uVar14;
  uint32_t aLow;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  uint64_t uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  int32_t bExp;
  int32_t aExp;
  uint local_b4;
  ulong local_b0;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  float_status *local_98;
  ulong local_90;
  ulong local_88;
  uint64_t local_80;
  ulong local_78;
  uint64_t local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_80 = b.low;
  uVar19 = a.low;
  uVar15 = a.high & 0xffffffffffff;
  uVar16 = a.high._6_2_ & 0x7fff;
  local_78 = b.high & 0xffffffffffff;
  local_b4 = b.high._6_2_ & 0x7fff;
  local_a4 = uVar16;
  local_70 = uVar19;
  local_68 = uVar15;
  if (uVar16 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
         uVar19 == 0) &&
       (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_80 == 0 || local_b4 != 0x7fff)) {
LAB_00871558:
      status->float_exception_flags = status->float_exception_flags | 1;
      uVar15 = 0x2000000000000000;
      if (status->snan_bit_is_one != '\0') {
        uVar15 = 0x1fffffffffffffff;
      }
      fVar1.high = uVar15 >> 0xe | 0x7fff000000000000;
      fVar1.low = -(ulong)((uint)uVar15 & 1);
      return fVar1;
    }
LAB_00871205:
    a = propagateFloat128NaN(a,b,status);
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_80 == 0) goto LAB_00871558;
      normalizeFloat128Subnormal(local_78,local_80,(int32_t *)&local_b4,&local_78,&local_80);
    }
    else if (local_b4 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_80 == 0) {
        return a;
      }
      goto LAB_00871205;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          uVar19 == 0) {
        return a;
      }
      normalizeFloat128Subnormal(uVar15,uVar19,(int32_t *)&local_a4,&local_68,&local_70);
      uVar16 = local_a4;
    }
    iVar17 = uVar16 - local_b4;
    if (-2 < iVar17) {
      bVar5 = iVar17 == -1 ^ 0xf;
      uVar10 = local_70 << bVar5;
      uVar12 = local_70 >> ((iVar17 == -1) + 0x31U & 0x3f) | (local_68 | 0x1000000000000) << bVar5;
      uVar18 = local_80 * 0x8000;
      uVar14 = local_78 << 0xf;
      local_60 = uVar14 | 0x8000000000000000;
      local_a0 = local_80 >> 0x31;
      uVar15 = local_a0 + local_60;
      bVar20 = uVar15 <= uVar12;
      bVar23 = uVar12 == uVar15;
      bVar21 = uVar18 <= uVar10;
      if (bVar21 && bVar23 || bVar20 && !bVar23) {
        bVar22 = uVar10 < uVar18;
        uVar10 = uVar10 + local_80 * -0x8000;
        uVar12 = (uVar12 - uVar15) - (ulong)bVar22;
      }
      local_a8 = local_b4;
      uVar16 = iVar17 - 0x40;
      if (iVar17 < 0x41) {
        uVar7 = (ulong)(bVar21 && bVar23 || bVar20 && !bVar23);
      }
      else {
        local_88 = local_60 >> 0x20;
        local_50 = uVar14 & 0xffffffff00000000 | 0x8000000000000000;
        local_90 = uVar15 & 0xffffffff;
        local_40 = uVar18 >> 0x20;
        local_48 = uVar18 & 0xffffffff;
        uVar2 = uVar16;
        do {
          local_38 = uVar10;
          local_b0 = (ulong)uVar2;
          uVar10 = 0xffffffffffffffff;
          if (uVar12 < uVar15) {
            uVar7 = 0xffffffff00000000;
            if (uVar12 < local_50) {
              uVar7 = uVar12 / local_88 << 0x20;
            }
            uVar3 = (uVar7 >> 0x20) * local_90;
            uVar11 = uVar7 * uVar15;
            uVar10 = local_38 - uVar11;
            lVar8 = ((uVar12 - ((uVar3 >> 0x20) + local_88 * (uVar7 >> 0x20))) -
                    (ulong)(local_38 < uVar11)) - (ulong)(uVar11 < uVar3 << 0x20);
            if (lVar8 < 0) {
              uVar3 = (0x100000000 - uVar7) * uVar15 + local_38;
              uVar11 = uVar10;
              do {
                uVar7 = uVar7 - 0x100000000;
                uVar10 = uVar11 + (uVar15 << 0x20);
                bVar20 = uVar3 < uVar11;
                uVar3 = uVar3 + (uVar15 << 0x20);
                lVar8 = lVar8 + local_88 + (ulong)bVar20;
                uVar11 = uVar10;
              } while (lVar8 < 0);
            }
            uVar10 = uVar10 >> 0x20 | lVar8 << 0x20;
            if (uVar10 < local_50) {
              uVar10 = uVar10 / local_88;
            }
            else {
              uVar10 = 0xffffffff;
            }
            uVar10 = uVar10 | uVar7;
          }
          uVar7 = uVar10 - 4;
          if (uVar10 < 4) {
            uVar7 = 0;
          }
          uVar11 = uVar7 >> 0x20;
          uVar10 = (uVar7 & 0xffffffff) * local_40;
          uVar3 = uVar10 + uVar11 * local_48;
          lVar8 = 0;
          if (CARRY8(uVar10,uVar11 * local_48)) {
            lVar8 = 0x100000000;
          }
          lVar9 = (uVar7 & 0xffffffff) * local_88 + uVar11 * local_90;
          uVar4 = uVar7 * uVar15;
          uVar3 = uVar11 * local_40 + uVar4 + (uVar3 >> 0x20) + lVar8 +
                  (ulong)(uVar7 * uVar18 < uVar3 << 0x20);
          uVar11 = uVar3 << 0x3d | uVar7 * uVar18 >> 3;
          uVar10 = -uVar11;
          uVar12 = ((uVar12 << 0x3d | local_38 >> 3) - (ulong)(uVar11 != 0)) -
                   ((ulong)((uint)(uVar3 < uVar4) +
                           (uint)(uVar4 < (ulong)(lVar9 << 0x20)) +
                           (int)((ulong)lVar9 >> 0x20) +
                           (int)(local_60 >> 0x20) * (int)(uVar7 >> 0x20)) << 0x3d | uVar3 >> 3);
          uVar16 = uVar2 - 0x3d;
          bVar20 = 0x3d < (int)uVar2;
          uVar2 = uVar16;
        } while (bVar20);
      }
      if ((int)uVar16 < -0x3f) {
        uVar19 = uVar12 >> 0xc;
        uVar10 = uVar10 >> 0xc | uVar12 << 0x34;
        uVar14 = local_a0 << 0x34 | uVar18 >> 0xc;
      }
      else {
        uVar3 = 0xffffffffffffffff;
        if (uVar12 < uVar15) {
          uVar11 = local_60 >> 0x20;
          uVar7 = 0xffffffff00000000;
          uVar14 = uVar14 & 0xffffffff00000000 | 0x8000000000000000;
          if (uVar12 < uVar14) {
            uVar7 = uVar12 / uVar11 << 0x20;
          }
          uVar13 = (uVar15 & 0xffffffff) * (uVar7 >> 0x20);
          uVar4 = uVar7 * uVar15;
          uVar3 = uVar10 - uVar4;
          lVar8 = ((uVar12 - ((uVar13 >> 0x20) + (uVar7 >> 0x20) * uVar11)) -
                  (ulong)(uVar10 < uVar4)) - (ulong)(uVar4 < uVar13 << 0x20);
          if (lVar8 < 0) {
            uVar4 = (0x100000000 - uVar7) * uVar15 + uVar10;
            uVar13 = uVar3;
            do {
              uVar7 = uVar7 - 0x100000000;
              uVar3 = uVar13 + (uVar15 << 0x20);
              bVar20 = uVar4 < uVar13;
              uVar4 = uVar4 + (uVar15 << 0x20);
              lVar8 = lVar8 + uVar11 + (ulong)bVar20;
              uVar13 = uVar3;
            } while (lVar8 < 0);
          }
          uVar3 = uVar3 >> 0x20 | lVar8 << 0x20;
          if (uVar3 < uVar14) {
            uVar3 = uVar3 / uVar11;
          }
          else {
            uVar3 = 0xffffffff;
          }
          uVar3 = uVar3 | uVar7;
          local_b0 = uVar18;
        }
        uVar7 = 0;
        if (3 < uVar3) {
          uVar7 = uVar3 - 4;
        }
        cVar6 = (char)uVar16;
        uVar7 = uVar7 >> (-cVar6 & 0x3fU);
        uVar14 = local_a0 << 0x34 | uVar18 >> 0xc;
        bVar5 = (byte)(uVar16 + 0x34);
        if ((int)uVar16 < -0x34) {
          uVar3 = uVar10 >> (-cVar6 - 0x34U & 0x3f) | uVar12 << (bVar5 & 0x3f);
          uVar12 = uVar12 >> (-cVar6 - 0x34U & 0x3f);
        }
        else {
          uVar3 = uVar10 << (bVar5 & 0x3f);
          if (uVar16 + 0x34 != 0) {
            uVar12 = uVar12 << (bVar5 & 0x3f) | uVar10 >> (0xcU - cVar6 & 0x3f);
          }
        }
        uVar10 = (uVar18 >> 0xc & 0xffffffff) * (uVar7 >> 0x20);
        uVar18 = (uVar7 & 0xffffffff) * (uVar14 >> 0x20);
        lVar8 = 0;
        uVar11 = uVar18 + uVar10;
        if (CARRY8(uVar18,uVar10)) {
          lVar8 = -0x100000000;
        }
        uVar18 = uVar7 * uVar14;
        uVar10 = uVar3 - uVar18;
        uVar19 = (((lVar8 - ((uVar7 >> 0x20) * (uVar14 >> 0x20) + uVar7 * (uVar15 >> 0xc) +
                            (uVar11 >> 0x20))) - (ulong)(uVar18 < uVar11 << 0x20)) + uVar12) -
                 (ulong)(uVar3 < uVar18);
      }
      zSig1 = uVar14 + uVar10;
      uVar12 = uVar14 + uVar10 * 2;
      uVar7 = uVar7 - 1;
      do {
        zSig0 = uVar19;
        uVar12 = uVar12 + uVar14 * -2;
        zSig1 = zSig1 - uVar14;
        uVar7 = uVar7 + 1;
        bVar20 = uVar10 < uVar14;
        uVar10 = uVar10 - uVar14;
        uVar19 = (zSig0 - (uVar15 >> 0xc)) - (ulong)bVar20;
      } while (-1 < (long)uVar19);
      lVar8 = uVar19 + zSig0 + (ulong)(uVar12 < uVar10);
      if (((-1 < lVar8) && ((uVar7 & 1) != 0 || (lVar8 != 0 || uVar12 != 0))) ||
         (uVar10 = zSig1, uVar19 = zSig0, (long)zSig0 < 0)) {
        zSig1 = -uVar10;
        zSig0 = -uVar19 - (ulong)(uVar10 != 0);
      }
      local_98 = status;
      local_58 = a.high;
      a = normalizeRoundAndPackFloat128
                    ((byte)((byte)(uVar19 >> 0x38) ^ a.high._7_1_) >> 7,local_b4 - 4,zSig0,zSig1,
                     status);
    }
  }
  return a;
}

Assistant:

float128 float128_rem(float128 a, float128 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig0, bSig1, q, term0, term1, term2;
    uint64_t allZero, alternateASig0, alternateASig1, sigMean1;
    int64_t sigMean0;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return a;
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    expDiff = aExp - bExp;
    if ( expDiff < -1 ) return a;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000),
        aSig1,
        15 - ( expDiff < 0 ),
        &aSig0,
        &aSig1
    );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    q = le128( bSig0, bSig1, aSig0, aSig1 );
    if ( q ) sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        shortShift192Left( term0, term1, term2, 61, &term1, &term2, &allZero );
        shortShift128Left( aSig0, aSig1, 61, &aSig0, &allZero );
        sub128( aSig0, 0, term1, term2, &aSig0, &aSig1 );
        expDiff -= 61;
    }
    if ( -64 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        q >>= - expDiff;
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
        expDiff += 52;
        if ( expDiff < 0 ) {
            shift128Right( aSig0, aSig1, - expDiff, &aSig0, &aSig1 );
        }
        else {
            shortShift128Left( aSig0, aSig1, expDiff, &aSig0, &aSig1 );
        }
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        sub128( aSig0, aSig1, term1, term2, &aSig0, &aSig1 );
    }
    else {
        shift128Right( aSig0, aSig1, 12, &aSig0, &aSig1 );
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
    }
    do {
        alternateASig0 = aSig0;
        alternateASig1 = aSig1;
        ++q;
        sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    } while ( 0 <= (int64_t) aSig0 );
    add128(
        aSig0, aSig1, alternateASig0, alternateASig1, (uint64_t *)&sigMean0, &sigMean1 );
    if (    ( sigMean0 < 0 )
         || ( ( ( sigMean0 | sigMean1 ) == 0 ) && ( q & 1 ) ) ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
    }
    zSign = ( (int64_t) aSig0 < 0 );
    if ( zSign ) sub128( 0, 0, aSig0, aSig1, &aSig0, &aSig1 );
    return normalizeRoundAndPackFloat128(aSign ^ zSign, bExp - 4, aSig0, aSig1,
                                         status);
}